

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O2

int CBS_get_utf8(CBS *cbs,uint32_t *out)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  uint uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  int iStack_38;
  uint8_t c;
  uint local_34;
  
  iStack_38 = (int)((ulong)in_RAX >> 0x18);
  iVar1 = CBS_get_u8(cbs,&c);
  iVar2 = 0;
  if (iVar1 != 0) {
    uVar4 = (uint)c;
    if (iStack_38 < 0) {
      uVar3 = (uint)c;
      if ((uVar4 & 0xffffffe0) == 0xc0) {
        lVar5 = 1;
        _iStack_38 = CONCAT44(0x80,iStack_38);
        uVar4 = 0x1f;
      }
      else if ((uVar3 & 0xfffffff0) == 0xe0) {
        lVar5 = 2;
        _iStack_38 = CONCAT44(0x800,iStack_38);
        uVar4 = 0xf;
      }
      else {
        if ((uVar3 & 0xfffffff8) != 0xf0) {
          return 0;
        }
        lVar5 = 3;
        _iStack_38 = CONCAT44(0x10000,iStack_38);
        uVar4 = 7;
      }
      uVar4 = uVar3 & uVar4;
      while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
        iVar2 = CBS_get_u8(cbs,&c);
        if (iVar2 == 0) {
          return 0;
        }
        if ((c & 0xffffffc0) != 0x80) {
          return 0;
        }
        uVar4 = uVar4 << 6 | c & 0x3f;
      }
      iVar2 = is_valid_code_point(uVar4);
      if (uVar4 < local_34 || iVar2 == 0) {
        return 0;
      }
    }
    *out = uVar4;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CBS_get_utf8(CBS *cbs, uint32_t *out) {
  uint8_t c;
  if (!CBS_get_u8(cbs, &c)) {
    return 0;
  }
  if (c <= 0x7f) {
    *out = c;
    return 1;
  }
  uint32_t v, lower_bound;
  size_t len;
  if ((c & TOP_BITS(3)) == TOP_BITS(2)) {
    v = c & BOTTOM_BITS(5);
    len = 1;
    lower_bound = 0x80;
  } else if ((c & TOP_BITS(4)) == TOP_BITS(3)) {
    v = c & BOTTOM_BITS(4);
    len = 2;
    lower_bound = 0x800;
  } else if ((c & TOP_BITS(5)) == TOP_BITS(4)) {
    v = c & BOTTOM_BITS(3);
    len = 3;
    lower_bound = 0x10000;
  } else {
    return 0;
  }
  for (size_t i = 0; i < len; i++) {
    if (!CBS_get_u8(cbs, &c) ||
        (c & TOP_BITS(2)) != TOP_BITS(1)) {
      return 0;
    }
    v <<= 6;
    v |= c & BOTTOM_BITS(6);
  }
  if (!is_valid_code_point(v) ||
      v < lower_bound) {
    return 0;
  }
  *out = v;
  return 1;
}